

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::Const::set_value(Const *this,string *new_value)

{
  int64_t iVar1;
  VarException *this_00;
  initializer_list<const_kratos::IRNode_*> __l;
  string local_68;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_48;
  Const *local_30;
  allocator<char> local_22;
  allocator_type local_21;
  
  if (new_value->_M_string_length << 3 < 9) {
    iVar1 = convert_string_to_int(new_value);
    (*(this->super_Var).super_IRNode._vptr_IRNode[0x2b])(this,iVar1);
    return;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"string value too big to be converted to integer",&local_22);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_30;
  local_30 = this;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            (&local_48,__l,&local_21);
  VarException::VarException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Const::set_value(const std::string &new_value) {
    // convert string to int
    if ((new_value.size() * 8) > sizeof(uint64_t)) {
        throw VarException("string value too big to be converted to integer", {this});
    }
    auto converted_value = convert_string_to_int(new_value);
    set_value(converted_value);
}